

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

double nearestPowerOfTwoScale(double value)

{
  int iVar1;
  double dVar2;
  int exp_scale;
  int local_c;
  
  dVar2 = frexp(value,&local_c);
  if ((ABS(dVar2) == 0.5) && (!NAN(ABS(dVar2)))) {
    local_c = local_c + -1;
  }
  iVar1 = local_c;
  ldexp(1.0,local_c);
  local_c = -iVar1;
  dVar2 = ldexp(1.0,local_c);
  return dVar2;
}

Assistant:

double nearestPowerOfTwoScale(const double value) {
  int exp_scale;
  // Decompose value into a normalized fraction and an integral power
  // of two.
  //
  // If arg is zero, returns zero and stores zero in *exp. Otherwise
  // (if arg is not zero), if no errors occur, returns the value x in
  // the range (-1;-0.5], [0.5; 1) and stores an integer value in *exp
  // such that x×2(*exp)=arg
  double check_x = std::frexp(value, &exp_scale);
  if (std::fabs(check_x) == 0.5) {
    check_x *= 2;
    exp_scale--;
  }
  const double check_value = check_x * std::pow(2, exp_scale);
  assert(check_value == value);
  exp_scale = -exp_scale;
  // Multiply a floating point value x(=1) by the number 2 raised to
  // the exp power
  double scale = std::ldexp(1, exp_scale);
  return scale;
}